

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variance_test.cc
# Opt level: O1

void __thiscall
anon_unknown.dwarf_2780404::
MainTestClass<unsigned_int_(*)(const_unsigned_char_*,_int,_const_unsigned_char_*,_int,_unsigned_int_*)>
::OneQuarterTest(MainTestClass<unsigned_int_(*)(const_unsigned_char_*,_int,_const_unsigned_char_*,_int,_unsigned_int_*)>
                 *this)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  long lVar9;
  undefined8 *puVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined2 uVar16;
  int iVar17;
  size_t __n;
  long lVar18;
  ulong uVar19;
  uint8_t *__s;
  SEARCH_METHODS *message;
  size_t __n_00;
  internal in_FPUControlWord;
  uint16_t in_FPUTagWord;
  undefined8 in_FPUInstructionPointer;
  int iVar22;
  undefined1 auVar20 [16];
  int iVar23;
  undefined1 auVar21 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  int iVar43;
  int iVar52;
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  int iVar53;
  int iVar56;
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 in_XMM11 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 in_XMM12 [16];
  undefined1 auVar61 [16];
  uint var;
  RegisterStateCheckMMX reg_check_mmx;
  uint expected;
  uint sse;
  Message local_50;
  AssertHelper local_48;
  uint local_3c;
  RegisterStateCheckMMX local_38;
  uint local_18;
  uint local_14;
  
  auVar15 = _DAT_00c40100;
  auVar14 = _DAT_00c400f0;
  auVar13 = _DAT_00c400e0;
  auVar12 = _DAT_00c400d0;
  auVar11 = _DAT_00c30d80;
  iVar17 = (this->params_).block_size;
  __n = (size_t)iVar17;
  __n_00 = (size_t)(iVar17 / 2);
  local_38.pre_fpu_env_[0]._0_1_ = in_FPUControlWord;
  if ((this->params_).use_high_bit_depth == false) {
    memset(this->src_,0xff,__n);
    memset(this->ref_,0xff,__n_00);
    __s = this->ref_ + __n_00;
  }
  else {
    uVar16 = (undefined2)(0xff << ((char)(this->params_).bit_depth - AOM_BITS_8 & 0x1f));
    if (iVar17 != 0) {
      lVar18 = __n - 1;
      auVar20._8_4_ = (int)lVar18;
      auVar20._0_8_ = lVar18;
      auVar20._12_4_ = (int)((ulong)lVar18 >> 0x20);
      uVar19 = 0;
      auVar20 = auVar20 ^ _DAT_00c30d80;
      lVar18 = (long)this->src_ * 2;
      do {
        auVar35._8_4_ = (int)uVar19;
        auVar35._0_8_ = uVar19;
        auVar35._12_4_ = (int)(uVar19 >> 0x20);
        auVar27 = (auVar35 | auVar15) ^ auVar11;
        iVar43 = auVar20._0_4_;
        iVar53 = -(uint)(iVar43 < auVar27._0_4_);
        iVar22 = auVar20._4_4_;
        auVar28._4_4_ = -(uint)(iVar22 < auVar27._4_4_);
        iVar52 = auVar20._8_4_;
        iVar56 = -(uint)(iVar52 < auVar27._8_4_);
        iVar23 = auVar20._12_4_;
        auVar28._12_4_ = -(uint)(iVar23 < auVar27._12_4_);
        auVar45._4_4_ = iVar53;
        auVar45._0_4_ = iVar53;
        auVar45._8_4_ = iVar56;
        auVar45._12_4_ = iVar56;
        auVar57 = pshuflw(in_XMM11,auVar45,0xe8);
        auVar30._4_4_ = -(uint)(auVar27._4_4_ == iVar22);
        auVar30._12_4_ = -(uint)(auVar27._12_4_ == iVar23);
        auVar30._0_4_ = auVar30._4_4_;
        auVar30._8_4_ = auVar30._12_4_;
        auVar61 = pshuflw(in_XMM12,auVar30,0xe8);
        auVar28._0_4_ = auVar28._4_4_;
        auVar28._8_4_ = auVar28._12_4_;
        auVar58 = pshuflw(auVar57,auVar28,0xe8);
        auVar27._8_4_ = 0xffffffff;
        auVar27._0_8_ = 0xffffffffffffffff;
        auVar27._12_4_ = 0xffffffff;
        auVar27 = (auVar58 | auVar61 & auVar57) ^ auVar27;
        auVar27 = packssdw(auVar27,auVar27);
        if ((auVar27 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          *(undefined2 *)(lVar18 + uVar19 * 2) = uVar16;
        }
        auVar28 = auVar30 & auVar45 | auVar28;
        auVar27 = packssdw(auVar28,auVar28);
        auVar58._8_4_ = 0xffffffff;
        auVar58._0_8_ = 0xffffffffffffffff;
        auVar58._12_4_ = 0xffffffff;
        auVar27 = packssdw(auVar27 ^ auVar58,auVar27 ^ auVar58);
        if ((auVar27._0_4_ >> 0x10 & 1) != 0) {
          *(undefined2 *)(lVar18 + 2 + uVar19 * 2) = uVar16;
        }
        auVar27 = (auVar35 | auVar14) ^ auVar11;
        iVar53 = -(uint)(iVar43 < auVar27._0_4_);
        auVar54._4_4_ = -(uint)(iVar22 < auVar27._4_4_);
        iVar56 = -(uint)(iVar52 < auVar27._8_4_);
        auVar54._12_4_ = -(uint)(iVar23 < auVar27._12_4_);
        auVar29._4_4_ = iVar53;
        auVar29._0_4_ = iVar53;
        auVar29._8_4_ = iVar56;
        auVar29._12_4_ = iVar56;
        auVar44._4_4_ = -(uint)(auVar27._4_4_ == iVar22);
        auVar44._12_4_ = -(uint)(auVar27._12_4_ == iVar23);
        auVar44._0_4_ = auVar44._4_4_;
        auVar44._8_4_ = auVar44._12_4_;
        auVar54._0_4_ = auVar54._4_4_;
        auVar54._8_4_ = auVar54._12_4_;
        auVar27 = auVar44 & auVar29 | auVar54;
        auVar27 = packssdw(auVar27,auVar27);
        auVar1._8_4_ = 0xffffffff;
        auVar1._0_8_ = 0xffffffffffffffff;
        auVar1._12_4_ = 0xffffffff;
        auVar27 = packssdw(auVar27 ^ auVar1,auVar27 ^ auVar1);
        if ((auVar27 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
          *(undefined2 *)(lVar18 + 4 + uVar19 * 2) = uVar16;
        }
        auVar30 = pshufhw(auVar29,auVar29,0x84);
        auVar45 = pshufhw(auVar44,auVar44,0x84);
        auVar28 = pshufhw(auVar30,auVar54,0x84);
        auVar31._8_4_ = 0xffffffff;
        auVar31._0_8_ = 0xffffffffffffffff;
        auVar31._12_4_ = 0xffffffff;
        auVar31 = (auVar28 | auVar45 & auVar30) ^ auVar31;
        auVar30 = packssdw(auVar31,auVar31);
        if ((auVar30 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
          *(undefined2 *)(lVar18 + 6 + uVar19 * 2) = uVar16;
        }
        auVar30 = (auVar35 | auVar13) ^ auVar11;
        iVar53 = -(uint)(iVar43 < auVar30._0_4_);
        auVar33._4_4_ = -(uint)(iVar22 < auVar30._4_4_);
        iVar56 = -(uint)(iVar52 < auVar30._8_4_);
        auVar33._12_4_ = -(uint)(iVar23 < auVar30._12_4_);
        auVar46._4_4_ = iVar53;
        auVar46._0_4_ = iVar53;
        auVar46._8_4_ = iVar56;
        auVar46._12_4_ = iVar56;
        auVar27 = pshuflw(auVar27,auVar46,0xe8);
        auVar32._4_4_ = -(uint)(auVar30._4_4_ == iVar22);
        auVar32._12_4_ = -(uint)(auVar30._12_4_ == iVar23);
        auVar32._0_4_ = auVar32._4_4_;
        auVar32._8_4_ = auVar32._12_4_;
        auVar30 = pshuflw(auVar61 & auVar57,auVar32,0xe8);
        in_XMM12 = auVar30 & auVar27;
        auVar33._0_4_ = auVar33._4_4_;
        auVar33._8_4_ = auVar33._12_4_;
        auVar27 = pshuflw(auVar27,auVar33,0xe8);
        auVar57._8_4_ = 0xffffffff;
        auVar57._0_8_ = 0xffffffffffffffff;
        auVar57._12_4_ = 0xffffffff;
        auVar57 = (auVar27 | in_XMM12) ^ auVar57;
        in_XMM11 = packssdw(auVar57,auVar57);
        if ((in_XMM11 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          *(undefined2 *)(lVar18 + 8 + uVar19 * 2) = uVar16;
        }
        auVar33 = auVar32 & auVar46 | auVar33;
        auVar27 = packssdw(auVar33,auVar33);
        auVar61._8_4_ = 0xffffffff;
        auVar61._0_8_ = 0xffffffffffffffff;
        auVar61._12_4_ = 0xffffffff;
        auVar27 = packssdw(auVar27 ^ auVar61,auVar27 ^ auVar61);
        if ((auVar27 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
          *(undefined2 *)(lVar18 + 10 + uVar19 * 2) = uVar16;
        }
        auVar27 = (auVar35 | auVar12) ^ auVar11;
        iVar43 = -(uint)(iVar43 < auVar27._0_4_);
        auVar47._4_4_ = -(uint)(iVar22 < auVar27._4_4_);
        iVar52 = -(uint)(iVar52 < auVar27._8_4_);
        auVar47._12_4_ = -(uint)(iVar23 < auVar27._12_4_);
        auVar34._4_4_ = iVar43;
        auVar34._0_4_ = iVar43;
        auVar34._8_4_ = iVar52;
        auVar34._12_4_ = iVar52;
        auVar24._4_4_ = -(uint)(auVar27._4_4_ == iVar22);
        auVar24._12_4_ = -(uint)(auVar27._12_4_ == iVar23);
        auVar24._0_4_ = auVar24._4_4_;
        auVar24._8_4_ = auVar24._12_4_;
        auVar47._0_4_ = auVar47._4_4_;
        auVar47._8_4_ = auVar47._12_4_;
        auVar27 = auVar24 & auVar34 | auVar47;
        auVar27 = packssdw(auVar27,auVar27);
        auVar2._8_4_ = 0xffffffff;
        auVar2._0_8_ = 0xffffffffffffffff;
        auVar2._12_4_ = 0xffffffff;
        auVar27 = packssdw(auVar27 ^ auVar2,auVar27 ^ auVar2);
        if ((auVar27 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
          *(undefined2 *)(lVar18 + 0xc + uVar19 * 2) = uVar16;
        }
        auVar35 = pshufhw(auVar34,auVar34,0x84);
        auVar27 = pshufhw(auVar24,auVar24,0x84);
        auVar30 = pshufhw(auVar35,auVar47,0x84);
        auVar3._8_4_ = 0xffffffff;
        auVar3._0_8_ = 0xffffffffffffffff;
        auVar3._12_4_ = 0xffffffff;
        auVar27 = packssdw(auVar27 & auVar35,(auVar30 | auVar27 & auVar35) ^ auVar3);
        if ((auVar27 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
          *(undefined2 *)(lVar18 + 0xe + uVar19 * 2) = uVar16;
        }
        uVar19 = uVar19 + 8;
      } while ((__n + 7 & 0xfffffffffffffff8) != uVar19);
    }
    auVar15 = _DAT_00c40100;
    auVar14 = _DAT_00c400f0;
    auVar13 = _DAT_00c400e0;
    auVar12 = _DAT_00c400d0;
    auVar11 = _DAT_00c30d80;
    if (iVar17 + 1U < 3) goto LAB_007e630f;
    lVar9 = (long)this->ref_ * 2;
    lVar18 = __n_00 - 1;
    auVar21._8_4_ = (int)lVar18;
    auVar21._0_8_ = lVar18;
    auVar21._12_4_ = (int)((ulong)lVar18 >> 0x20);
    uVar19 = 0;
    auVar21 = auVar21 ^ _DAT_00c30d80;
    do {
      auVar25._8_4_ = (int)uVar19;
      auVar25._0_8_ = uVar19;
      auVar25._12_4_ = (int)(uVar19 >> 0x20);
      auVar20 = (auVar25 | auVar15) ^ auVar11;
      iVar43 = auVar21._0_4_;
      iVar53 = -(uint)(iVar43 < auVar20._0_4_);
      iVar22 = auVar21._4_4_;
      auVar37._4_4_ = -(uint)(iVar22 < auVar20._4_4_);
      iVar52 = auVar21._8_4_;
      iVar56 = -(uint)(iVar52 < auVar20._8_4_);
      iVar23 = auVar21._12_4_;
      auVar37._12_4_ = -(uint)(iVar23 < auVar20._12_4_);
      auVar48._4_4_ = iVar53;
      auVar48._0_4_ = iVar53;
      auVar48._8_4_ = iVar56;
      auVar48._12_4_ = iVar56;
      auVar27 = pshuflw(in_XMM11,auVar48,0xe8);
      auVar36._4_4_ = -(uint)(auVar20._4_4_ == iVar22);
      auVar36._12_4_ = -(uint)(auVar20._12_4_ == iVar23);
      auVar36._0_4_ = auVar36._4_4_;
      auVar36._8_4_ = auVar36._12_4_;
      auVar35 = pshuflw(in_XMM12,auVar36,0xe8);
      auVar37._0_4_ = auVar37._4_4_;
      auVar37._8_4_ = auVar37._12_4_;
      auVar20 = pshuflw(auVar27,auVar37,0xe8);
      auVar59._8_4_ = 0xffffffff;
      auVar59._0_8_ = 0xffffffffffffffff;
      auVar59._12_4_ = 0xffffffff;
      auVar59 = (auVar20 | auVar35 & auVar27) ^ auVar59;
      auVar20 = packssdw(auVar59,auVar59);
      if ((auVar20 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        *(undefined2 *)(lVar9 + uVar19 * 2) = uVar16;
      }
      auVar37 = auVar36 & auVar48 | auVar37;
      auVar20 = packssdw(auVar37,auVar37);
      auVar4._8_4_ = 0xffffffff;
      auVar4._0_8_ = 0xffffffffffffffff;
      auVar4._12_4_ = 0xffffffff;
      auVar20 = packssdw(auVar20 ^ auVar4,auVar20 ^ auVar4);
      if ((auVar20._0_4_ >> 0x10 & 1) != 0) {
        *(undefined2 *)(lVar9 + 2 + uVar19 * 2) = uVar16;
      }
      auVar20 = (auVar25 | auVar14) ^ auVar11;
      iVar53 = -(uint)(iVar43 < auVar20._0_4_);
      auVar55._4_4_ = -(uint)(iVar22 < auVar20._4_4_);
      iVar56 = -(uint)(iVar52 < auVar20._8_4_);
      auVar55._12_4_ = -(uint)(iVar23 < auVar20._12_4_);
      auVar38._4_4_ = iVar53;
      auVar38._0_4_ = iVar53;
      auVar38._8_4_ = iVar56;
      auVar38._12_4_ = iVar56;
      auVar49._4_4_ = -(uint)(auVar20._4_4_ == iVar22);
      auVar49._12_4_ = -(uint)(auVar20._12_4_ == iVar23);
      auVar49._0_4_ = auVar49._4_4_;
      auVar49._8_4_ = auVar49._12_4_;
      auVar55._0_4_ = auVar55._4_4_;
      auVar55._8_4_ = auVar55._12_4_;
      auVar20 = auVar49 & auVar38 | auVar55;
      auVar20 = packssdw(auVar20,auVar20);
      auVar5._8_4_ = 0xffffffff;
      auVar5._0_8_ = 0xffffffffffffffff;
      auVar5._12_4_ = 0xffffffff;
      auVar20 = packssdw(auVar20 ^ auVar5,auVar20 ^ auVar5);
      if ((auVar20 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
        *(undefined2 *)(lVar9 + 4 + uVar19 * 2) = uVar16;
      }
      auVar30 = pshufhw(auVar38,auVar38,0x84);
      auVar45 = pshufhw(auVar49,auVar49,0x84);
      auVar28 = pshufhw(auVar30,auVar55,0x84);
      auVar39._8_4_ = 0xffffffff;
      auVar39._0_8_ = 0xffffffffffffffff;
      auVar39._12_4_ = 0xffffffff;
      auVar39 = (auVar28 | auVar45 & auVar30) ^ auVar39;
      auVar30 = packssdw(auVar39,auVar39);
      if ((auVar30 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
        *(undefined2 *)(lVar9 + 6 + uVar19 * 2) = uVar16;
      }
      auVar30 = (auVar25 | auVar13) ^ auVar11;
      iVar53 = -(uint)(iVar43 < auVar30._0_4_);
      auVar41._4_4_ = -(uint)(iVar22 < auVar30._4_4_);
      iVar56 = -(uint)(iVar52 < auVar30._8_4_);
      auVar41._12_4_ = -(uint)(iVar23 < auVar30._12_4_);
      auVar50._4_4_ = iVar53;
      auVar50._0_4_ = iVar53;
      auVar50._8_4_ = iVar56;
      auVar50._12_4_ = iVar56;
      auVar20 = pshuflw(auVar20,auVar50,0xe8);
      auVar40._4_4_ = -(uint)(auVar30._4_4_ == iVar22);
      auVar40._12_4_ = -(uint)(auVar30._12_4_ == iVar23);
      auVar40._0_4_ = auVar40._4_4_;
      auVar40._8_4_ = auVar40._12_4_;
      auVar27 = pshuflw(auVar35 & auVar27,auVar40,0xe8);
      in_XMM12 = auVar27 & auVar20;
      auVar41._0_4_ = auVar41._4_4_;
      auVar41._8_4_ = auVar41._12_4_;
      auVar20 = pshuflw(auVar20,auVar41,0xe8);
      auVar60._8_4_ = 0xffffffff;
      auVar60._0_8_ = 0xffffffffffffffff;
      auVar60._12_4_ = 0xffffffff;
      auVar60 = (auVar20 | in_XMM12) ^ auVar60;
      in_XMM11 = packssdw(auVar60,auVar60);
      if ((in_XMM11 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        *(undefined2 *)(lVar9 + 8 + uVar19 * 2) = uVar16;
      }
      auVar41 = auVar40 & auVar50 | auVar41;
      auVar20 = packssdw(auVar41,auVar41);
      auVar6._8_4_ = 0xffffffff;
      auVar6._0_8_ = 0xffffffffffffffff;
      auVar6._12_4_ = 0xffffffff;
      auVar20 = packssdw(auVar20 ^ auVar6,auVar20 ^ auVar6);
      if ((auVar20 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
        *(undefined2 *)(lVar9 + 10 + uVar19 * 2) = uVar16;
      }
      auVar20 = (auVar25 | auVar12) ^ auVar11;
      iVar43 = -(uint)(iVar43 < auVar20._0_4_);
      auVar51._4_4_ = -(uint)(iVar22 < auVar20._4_4_);
      iVar52 = -(uint)(iVar52 < auVar20._8_4_);
      auVar51._12_4_ = -(uint)(iVar23 < auVar20._12_4_);
      auVar42._4_4_ = iVar43;
      auVar42._0_4_ = iVar43;
      auVar42._8_4_ = iVar52;
      auVar42._12_4_ = iVar52;
      auVar26._4_4_ = -(uint)(auVar20._4_4_ == iVar22);
      auVar26._12_4_ = -(uint)(auVar20._12_4_ == iVar23);
      auVar26._0_4_ = auVar26._4_4_;
      auVar26._8_4_ = auVar26._12_4_;
      auVar51._0_4_ = auVar51._4_4_;
      auVar51._8_4_ = auVar51._12_4_;
      auVar20 = auVar26 & auVar42 | auVar51;
      auVar20 = packssdw(auVar20,auVar20);
      auVar7._8_4_ = 0xffffffff;
      auVar7._0_8_ = 0xffffffffffffffff;
      auVar7._12_4_ = 0xffffffff;
      auVar20 = packssdw(auVar20 ^ auVar7,auVar20 ^ auVar7);
      if ((auVar20 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
        *(undefined2 *)(lVar9 + 0xc + uVar19 * 2) = uVar16;
      }
      auVar27 = pshufhw(auVar42,auVar42,0x84);
      auVar20 = pshufhw(auVar26,auVar26,0x84);
      auVar35 = pshufhw(auVar27,auVar51,0x84);
      auVar8._8_4_ = 0xffffffff;
      auVar8._0_8_ = 0xffffffffffffffff;
      auVar8._12_4_ = 0xffffffff;
      auVar20 = packssdw(auVar20 & auVar27,(auVar35 | auVar20 & auVar27) ^ auVar8);
      if ((auVar20 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
        *(undefined2 *)(lVar9 + 0xe + uVar19 * 2) = uVar16;
      }
      uVar19 = uVar19 + 8;
    } while ((__n_00 + 7 & 0xfffffffffffffff8) != uVar19);
    if (iVar17 + 1U < 3) goto LAB_007e630f;
    __s = (uint8_t *)(lVar9 + __n_00 * 2);
    __n_00 = __n_00 * 2;
  }
  memset(__s,0,__n_00);
LAB_007e630f:
  local_38.pre_fpu_env_._12_4_ = SUB84(in_FPUInstructionPointer,0);
  local_38.pre_fpu_env_[8] = (uint16_t)((ulong)in_FPUInstructionPointer >> 0x20);
  iVar17 = (this->params_).width;
  local_38.pre_fpu_env_[4] = in_FPUTagWord;
  local_3c = (*(this->params_).func)(this->src_,iVar17,this->ref_,iVar17,&local_14);
  libaom_test::RegisterStateCheckMMX::Check(&local_38);
  iVar43 = (this->params_).block_size * 0xfe01;
  iVar17 = iVar43 + 3;
  if (-1 < iVar43) {
    iVar17 = iVar43;
  }
  local_18 = iVar17 >> 2;
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
            ((internal *)&local_38,"expected","var",&local_18,&local_3c);
  if (local_38.pre_fpu_env_[0]._0_1_ == (internal)0x0) {
    testing::Message::Message(&local_50);
    puVar10 = (undefined8 *)
              CONCAT44(local_38.pre_fpu_env_._12_4_,
                       CONCAT22(local_38.pre_fpu_env_[5],local_38.pre_fpu_env_[4]));
    if (puVar10 == (undefined8 *)0x0) {
      message = "";
    }
    else {
      message = (SEARCH_METHODS *)*puVar10;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_48,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/variance_test.cc"
               ,0x308,(char *)message);
    testing::internal::AssertHelper::operator=(&local_48,&local_50);
    testing::internal::AssertHelper::~AssertHelper(&local_48);
    if (local_50.ss_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl !=
        (__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
         )0x0) {
      (**(code **)(*(long *)local_50.ss_._M_t.
                            super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .
                            super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                            ._M_head_impl + 8))();
    }
  }
  puVar10 = (undefined8 *)
            CONCAT44(local_38.pre_fpu_env_._12_4_,
                     CONCAT22(local_38.pre_fpu_env_[5],local_38.pre_fpu_env_[4]));
  if (puVar10 != (undefined8 *)0x0) {
    if ((undefined8 *)*puVar10 != puVar10 + 2) {
      operator_delete((undefined8 *)*puVar10);
    }
    operator_delete(puVar10);
  }
  return;
}

Assistant:

void MainTestClass<VarianceFunctionType>::OneQuarterTest() {
  const int half = block_size() / 2;
  if (!use_high_bit_depth()) {
    memset(src_, 255, block_size());
    memset(ref_, 255, half);
    memset(ref_ + half, 0, half);
  } else {
    aom_memset16(CONVERT_TO_SHORTPTR(src_), 255 << byte_shift(), block_size());
    aom_memset16(CONVERT_TO_SHORTPTR(ref_), 255 << byte_shift(), half);
    aom_memset16(CONVERT_TO_SHORTPTR(ref_) + half, 0, half);
  }
  unsigned int sse, var, expected;
  API_REGISTER_STATE_CHECK(
      var = params_.func(src_, width(), ref_, width(), &sse));
  expected = block_size() * 255 * 255 / 4;
  EXPECT_EQ(expected, var);
}